

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

void __thiscall cnn::Parameters::accumulate_grad(Parameters *this,Tensor *d)

{
  Tensor *in_stack_ffffffffffffffd8;
  MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_ffffffffffffffe0;
  
  Tensor::vec(in_stack_ffffffffffffffd8);
  Tensor::vec(in_stack_ffffffffffffffd8);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::operator+=
            (in_stack_ffffffffffffffe0,
             (MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void Parameters::accumulate_grad(const Tensor& d) {
#if HAVE_CUDA
  CUBLAS_CHECK(cublasSaxpy(cublas_handle, g.d.size(), kSCALAR_ONE, d.v, 1, g.v, 1));
#else
  g.vec() += d.vec();
#endif
}